

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::
ContainerEqMatcher<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>
::
MatchAndExplain<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>
          (ContainerEqMatcher<std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>
           *this,vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                 *lhs,MatchResultListener *listener)

{
  ostream *os;
  bool bVar1;
  bool bVar2;
  external_fixup *peVar3;
  external_fixup *peVar4;
  __normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
  it_1;
  pointer rhs;
  external_fixup *peVar5;
  __normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>
  it;
  external_fixup *peVar6;
  bool bVar7;
  char *local_38;
  
  peVar6 = (lhs->
           super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
           )._M_impl.super__Vector_impl_data._M_start;
  peVar5 = (lhs->
           super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  peVar3 = *(external_fixup **)this;
  if ((long)peVar5 - (long)peVar6 == *(long *)(this + 8) - (long)peVar3) {
    bVar7 = peVar6 == peVar5;
    if (bVar7) goto LAB_00174dcf;
    bVar7 = pstore::repo::external_fixup::operator==(peVar6,peVar3);
    if (bVar7) {
      do {
        peVar3 = peVar3 + 1;
        peVar6 = peVar6 + 1;
        bVar7 = peVar6 == peVar5;
        if (bVar7) goto LAB_00174dcf;
        bVar7 = pstore::repo::external_fixup::operator==(peVar6,peVar3);
      } while (bVar7);
    }
  }
  bVar7 = false;
LAB_00174dcf:
  if ((!bVar7) && (os = listener->stream_, os != (ostream *)0x0)) {
    rhs = (lhs->
          super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
          )._M_impl.super__Vector_impl_data._M_start;
    if (rhs == (lhs->
               super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
      local_38 = "which";
    }
    else {
      bVar2 = false;
      do {
        peVar6 = *(external_fixup **)this;
        peVar5 = *(external_fixup **)(this + 8);
        while ((peVar3 = peVar5, peVar6 != peVar5 &&
               (bVar1 = pstore::repo::external_fixup::operator==(peVar6,rhs), peVar3 = peVar6,
               !bVar1))) {
          peVar6 = peVar6 + 1;
        }
        if (peVar3 == *(external_fixup **)(this + 8)) {
          if (bVar2) {
            std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      (os,"which has these unexpected elements: ",0x25);
            bVar2 = true;
          }
          pstore::repo::operator<<(os,rhs);
        }
        rhs = rhs + 1;
      } while (rhs != (lhs->
                      super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
      local_38 = "which";
      if (bVar2) {
        local_38 = ",\nand";
      }
    }
    peVar6 = *(external_fixup **)this;
    if (peVar6 != *(external_fixup **)(this + 8)) {
      bVar2 = false;
      do {
        peVar5 = (lhs->
                 super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        peVar3 = (lhs->
                 super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        while ((peVar4 = peVar3, peVar5 != peVar3 &&
               (bVar1 = pstore::repo::external_fixup::operator==(peVar5,peVar6), peVar4 = peVar5,
               !bVar1))) {
          peVar5 = peVar5 + 1;
        }
        if (peVar4 == (lhs->
                      super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
          if (bVar2) {
            std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(os,local_38,5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (os," doesn\'t have these expected elements: ",0x27);
            bVar2 = true;
          }
          pstore::repo::operator<<(os,peVar6);
        }
        peVar6 = peVar6 + 1;
      } while (peVar6 != *(external_fixup **)(this + 8));
    }
  }
  return bVar7;
}

Assistant:

bool MatchAndExplain(const LhsContainer& lhs,
                       MatchResultListener* listener) const {
    typedef internal::StlContainerView<
        typename std::remove_const<LhsContainer>::type>
        LhsView;
    typedef typename LhsView::type LhsStlContainer;
    StlContainerReference lhs_stl_container = LhsView::ConstReference(lhs);
    if (lhs_stl_container == expected_)
      return true;

    ::std::ostream* const os = listener->stream();
    if (os != nullptr) {
      // Something is different. Check for extra values first.
      bool printed_header = false;
      for (typename LhsStlContainer::const_iterator it =
               lhs_stl_container.begin();
           it != lhs_stl_container.end(); ++it) {
        if (internal::ArrayAwareFind(expected_.begin(), expected_.end(), *it) ==
            expected_.end()) {
          if (printed_header) {
            *os << ", ";
          } else {
            *os << "which has these unexpected elements: ";
            printed_header = true;
          }
          UniversalPrint(*it, os);
        }
      }

      // Now check for missing values.
      bool printed_header2 = false;
      for (typename StlContainer::const_iterator it = expected_.begin();
           it != expected_.end(); ++it) {
        if (internal::ArrayAwareFind(
                lhs_stl_container.begin(), lhs_stl_container.end(), *it) ==
            lhs_stl_container.end()) {
          if (printed_header2) {
            *os << ", ";
          } else {
            *os << (printed_header ? ",\nand" : "which")
                << " doesn't have these expected elements: ";
            printed_header2 = true;
          }
          UniversalPrint(*it, os);
        }
      }
    }

    return false;
  }